

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::StreamWriter::Write
          (StreamWriter *this,char *a_pBuf)

{
  std::operator<<(this->m_ostream,a_pBuf);
  return;
}

Assistant:

void Write(const char *a_pBuf) { m_ostream << a_pBuf; }